

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ct_chat.cpp
# Opt level: O0

bool CT_Responder(event_t *ev)

{
  char *pcVar1;
  FString local_38 [3];
  FString local_20;
  event_t *local_18;
  event_t *ev_local;
  
  if ((chatmodeon != 0) && (ev->type == '\x04')) {
    local_18 = ev;
    if ((ev->subtype == '\x01') || (ev->subtype == '\x02')) {
      if (ev->data1 == 0xd) {
        ShoveChatStr((char *)ChatQueue,(char)chatmodeon + 0xff);
        CT_Stop();
        return true;
      }
      if (ev->data1 == 0x1b) {
        CT_Stop();
        return true;
      }
      if (ev->data1 == 8) {
        CT_BackSpace();
        return true;
      }
      if ((ev->data1 == 0x43) && ((ev->data3 & 2U) != 0)) {
        I_PutInClipboard((char *)ChatQueue);
        return true;
      }
      if ((ev->data1 == 0x56) && ((ev->data3 & 2U) != 0)) {
        I_GetFromClipboard(SUB81(&local_20,0));
        pcVar1 = FString::operator_cast_to_char_(&local_20);
        CT_PasteChat(pcVar1);
        FString::~FString(&local_20);
      }
    }
    else {
      if (ev->subtype == '\x04') {
        if (((ev->data2 == 0) || (ev->data1 < 0x30)) || (0x39 < ev->data1)) {
          CT_AddChar((char)ev->data1);
        }
        else {
          pcVar1 = FStringCVar::operator_cast_to_char_(chat_macros[ev->data1 + -0x30]);
          ShoveChatStr(pcVar1,(char)chatmodeon + 0xff);
          CT_Stop();
        }
        return true;
      }
      if (ev->subtype == '\n') {
        I_GetFromClipboard(SUB81(local_38,0));
        pcVar1 = FString::operator_cast_to_char_(local_38);
        CT_PasteChat(pcVar1);
        FString::~FString(local_38);
      }
    }
  }
  return false;
}

Assistant:

bool CT_Responder (event_t *ev)
{
	if (chatmodeon && ev->type == EV_GUI_Event)
	{
		if (ev->subtype == EV_GUI_KeyDown || ev->subtype == EV_GUI_KeyRepeat)
		{
			if (ev->data1 == '\r')
			{
				ShoveChatStr ((char *)ChatQueue, chatmodeon - 1);
				CT_Stop ();
				return true;
			}
			else if (ev->data1 == GK_ESCAPE)
			{
				CT_Stop ();
				return true;
			}
			else if (ev->data1 == '\b')
			{
				CT_BackSpace ();
				return true;
			}
#ifdef __APPLE__
			else if (ev->data1 == 'C' && (ev->data3 & GKM_META))
#else // !__APPLE__
			else if (ev->data1 == 'C' && (ev->data3 & GKM_CTRL))
#endif // __APPLE__
			{
				I_PutInClipboard ((char *)ChatQueue);
				return true;
			}
#ifdef __APPLE__
			else if (ev->data1 == 'V' && (ev->data3 & GKM_META))
#else // !__APPLE__
			else if (ev->data1 == 'V' && (ev->data3 & GKM_CTRL))
#endif // __APPLE__
			{
				CT_PasteChat(I_GetFromClipboard(false));
			}
		}
		else if (ev->subtype == EV_GUI_Char)
		{
			// send a macro
			if (ev->data2 && (ev->data1 >= '0' && ev->data1 <= '9'))
			{
				ShoveChatStr (*chat_macros[ev->data1 - '0'], chatmodeon - 1);
				CT_Stop ();
			}
			else
			{
				CT_AddChar (char(ev->data1));
			}
			return true;
		}
#ifdef __unix__
		else if (ev->subtype == EV_GUI_MButtonDown)
		{
			CT_PasteChat(I_GetFromClipboard(true));
		}
#endif
	}

	return false;
}